

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QSslEllipticCurve curve)

{
  Stream *pSVar1;
  long *plVar2;
  undefined4 in_register_00000034;
  QDebug *pQVar3;
  QTextStream *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QSslEllipticCurve local_44;
  QString local_40;
  long local_28;
  
  pQVar3 = (QDebug *)CONCAT44(in_register_00000034,curve.id);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,pQVar3);
  plVar2 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar2 + 0x30) = 0;
  pQVar4 = (QTextStream *)pQVar3->stream;
  QVar5.m_data = (storage_type *)0x12;
  QVar5.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar4,(QString *)&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)pQVar3->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)pQVar3->stream,' ');
  }
  QSslEllipticCurve::shortName(&local_40,&local_44);
  if (local_40.d.ptr == (char16_t *)0x0) {
    local_40.d.ptr = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)pQVar3,(ulong)local_40.d.ptr);
  pQVar4 = (QTextStream *)pQVar3->stream;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)pQVar3->stream;
  }
  QTextStream::operator<<(pQVar4,')');
  if (((QTextStream *)pQVar3->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)pQVar3->stream,' ');
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pSVar1 = pQVar3->stream;
  pQVar3->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QSslEllipticCurve curve)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslEllipticCurve(" << curve.shortName() << ')';
    return debug;
}